

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_map * mg_map_copy_ca(mg_map *map,mg_allocator *allocator)

{
  uint uVar1;
  mg_map *buf;
  mg_string *pmVar2;
  mg_value *pmVar3;
  uint32_t i;
  ulong uVar4;
  uint32_t i_1;
  ulong uVar5;
  uint32_t i_2;
  ulong uVar6;
  
  if ((map == (mg_map *)0x0) || (buf = mg_map_alloc(map->size,allocator), buf == (mg_map *)0x0)) {
LAB_001093b2:
    buf = (mg_map *)0x0;
  }
  else {
    uVar1 = map->size;
    buf->capacity = uVar1;
    buf->size = uVar1;
    for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      pmVar2 = mg_string_copy_ca(map->keys[uVar4],allocator);
      buf->keys[uVar4] = pmVar2;
      uVar6 = uVar4;
      if (buf->keys[uVar4] == (mg_string *)0x0) {
LAB_0010936f:
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          mg_string_destroy(map->keys[uVar5]);
        }
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          mg_value_destroy(map->values[uVar6]);
        }
        mg_allocator_free(&mg_system_allocator,buf);
        goto LAB_001093b2;
      }
      pmVar3 = mg_value_copy_ca(map->values[uVar4],allocator);
      buf->values[uVar4] = pmVar3;
      if (buf->values[uVar4] == (mg_value *)0x0) {
        uVar6 = uVar4 + 1;
        goto LAB_0010936f;
      }
      uVar1 = map->size;
    }
  }
  return buf;
}

Assistant:

mg_map *mg_map_copy_ca(const mg_map *map, mg_allocator *allocator) {
  if (!map) {
    return NULL;
  }
  mg_map *nmap = mg_map_alloc(map->size, allocator);
  if (!nmap) {
    return NULL;
  }
  nmap->capacity = map->size;
  nmap->size = map->size;
  uint32_t keys_copied = 0;
  uint32_t values_copied = 0;
  for (uint32_t i = 0; i < map->size; ++i) {
    nmap->keys[i] = mg_string_copy_ca(map->keys[i], allocator);
    if (!nmap->keys[i]) {
      goto cleanup;
    }
    keys_copied++;
    nmap->values[i] = mg_value_copy_ca(map->values[i], allocator);
    if (!nmap->values[i]) {
      goto cleanup;
    }
    values_copied++;
  }
  return nmap;

cleanup:
  for (uint32_t i = 0; i < keys_copied; ++i) {
    mg_string_destroy(map->keys[i]);
  }
  for (uint32_t i = 0; i < values_copied; ++i) {
    mg_value_destroy(map->values[i]);
  }
  mg_allocator_free(&mg_system_allocator, nmap);
  return NULL;
}